

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t *ts;
  int iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  SPIRType *pSVar5;
  size_type sVar6;
  CompilerError *this_00;
  char (*ts_1) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1_00;
  uint *ts_1_01;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  char (*ts_2) [2];
  uint *in_R9;
  uint32_t *ts_00;
  allocator local_59;
  string local_58;
  uint32_t id_local;
  
  iVar1 = *(int *)&(type->super_IVariant).field_0xc;
  id_local = id;
  if (iVar1 != 0xf && (type->pointer == true && type->storage == StorageClassPhysicalStorageBuffer))
  {
    pSVar5 = Compiler::get_pointee_type(&this->super_Compiler,type);
    ts_2 = (char (*) [2])(this->super_Compiler)._vptr_Compiler;
    lVar9 = 0;
    ts_1 = (char (*) [2])0x0;
    (**(_func_int **)(ts_2 + 0x4c))(__return_storage_ptr__,this,pSVar5);
    for (uVar8 = 0; uVar8 < (type->array).super_VectorView<unsigned_int>.buffer_size;
        uVar8 = uVar8 + 1) {
      if ((type->array_size_literal).super_VectorView<bool>.ptr[uVar8] == true) {
        join<unsigned_int_const&,char_const(&)[2]>
                  (&local_58,
                   (spirv_cross *)((long)(type->array).super_VectorView<unsigned_int>.ptr + lVar9),
                   (uint *)0x3835c0,ts_1);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        ts_1 = (char (*) [2])0x3835c0;
        join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                  (&local_58,(spirv_cross *)0x370344,
                   (char (*) [3])((long)(type->array).super_VectorView<unsigned_int>.ptr + lVar9),
                   (uint *)0x3835c0,ts_2);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::~string((string *)&local_58);
      lVar9 = lVar9 + 4;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  switch(iVar1) {
  case 1:
    pcVar10 = "void";
    break;
  default:
    goto switchD_00270db1_caseD_2;
  case 8:
    bVar4 = is_legacy(this);
    if (bVar4) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"Unsigned integers are not supported on legacy targets.",
                 &local_59);
      CompilerError::CompilerError(this_00,&local_58);
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
switchD_00270db1_caseD_2:
    uVar2 = type->vecsize;
    uVar3 = type->columns;
    if (uVar3 == 1 && uVar2 == 1) {
      switch(*(undefined4 *)&(type->super_IVariant).field_0xc) {
      case 2:
        pcVar10 = "bool";
        break;
      case 3:
        pcVar10 = (this->backend).basic_int8_type;
        break;
      case 4:
        pcVar10 = (this->backend).basic_uint8_type;
        break;
      case 5:
        pcVar10 = (this->backend).basic_int16_type;
        break;
      case 6:
        pcVar10 = (this->backend).basic_uint16_type;
        break;
      case 7:
        pcVar10 = (this->backend).basic_int_type;
        break;
      case 8:
        pcVar10 = (this->backend).basic_uint_type;
        break;
      case 9:
        pcVar10 = "int64_t";
        break;
      case 10:
        pcVar10 = "uint64_t";
        break;
      case 0xb:
        pcVar10 = "atomic_uint";
        break;
      case 0xc:
        pcVar10 = "float16_t";
        break;
      case 0xd:
        pcVar10 = "float";
        break;
      case 0xe:
        pcVar10 = "double";
        break;
      default:
        goto switchD_00270eee_default;
      }
      break;
    }
    ts = &type->vecsize;
    if (uVar2 < 2 || uVar3 != 1) {
      uVar7 = *(int *)&(type->super_IVariant).field_0xc - 2;
      uVar8 = (ulong)uVar7;
      if (uVar2 == uVar3) {
        if (uVar7 < 0xd) {
          ts_1_01 = (uint *)((long)&switchD_00271001::switchdataD_00376c00 +
                            (long)(int)(&switchD_00271001::switchdataD_00376c00)[uVar8]);
          switch(uVar8) {
          case 0:
            pcVar10 = "bmat";
            break;
          default:
            goto switchD_00270eee_default;
          case 5:
            pcVar10 = "imat";
            break;
          case 6:
            pcVar10 = "umat";
            break;
          case 10:
            pcVar10 = "f16mat";
            goto LAB_002711aa;
          case 0xb:
            pcVar10 = "f16mat";
            goto LAB_002711df;
          case 0xc:
            pcVar10 = "dmat";
          }
          goto LAB_00271175;
        }
      }
      else if (uVar7 < 0xd) {
        ts_00 = &type->columns;
        switch(uVar8) {
        case 0:
          pcVar10 = "bmat";
          break;
        default:
          goto switchD_00270eee_default;
        case 5:
          pcVar10 = "imat";
          break;
        case 6:
          pcVar10 = "umat";
          break;
        case 10:
          join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"f16mat",(char (*) [7])ts_00,
                     (uint *)0x395dcf,(char (*) [2])ts,in_R9);
          return __return_storage_ptr__;
        case 0xb:
          join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)0x37f0a0,(char (*) [4])ts_00,
                     (uint *)0x395dcf,(char (*) [2])ts,in_R9);
          return __return_storage_ptr__;
        case 0xc:
          pcVar10 = "dmat";
        }
        join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)pcVar10,(char (*) [5])ts_00,
                   (uint *)0x395dcf,(char (*) [2])ts,in_R9);
        return __return_storage_ptr__;
      }
switchD_00270eee_default:
      pcVar10 = "???";
      break;
    }
    ts_1_01 = &switchD_00270fc0::switchdataD_00376c34;
    switch(*(undefined4 *)&(type->super_IVariant).field_0xc) {
    case 2:
      pcVar10 = "bvec";
      goto LAB_00271175;
    case 3:
      pcVar10 = "i8vec";
      goto LAB_00271101;
    case 4:
      pcVar10 = "u8vec";
LAB_00271101:
      join<char_const(&)[6],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar10,(char (*) [6])ts,
                 &switchD_00270fc0::switchdataD_00376c34);
      return __return_storage_ptr__;
    case 5:
      pcVar10 = "i16vec";
      break;
    case 6:
      pcVar10 = "u16vec";
      break;
    case 7:
      pcVar10 = "ivec";
      goto LAB_00271175;
    case 8:
      pcVar10 = "uvec";
      goto LAB_00271175;
    case 9:
      pcVar10 = "i64vec";
      break;
    case 10:
      pcVar10 = "u64vec";
      break;
    default:
      goto switchD_00270eee_default;
    case 0xc:
      pcVar10 = "f16vec";
      break;
    case 0xd:
      pcVar10 = "i64vec";
LAB_002711df:
      join<char_const(&)[4],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)(pcVar10 + 3),(char (*) [4])ts,ts_1_01);
      return __return_storage_ptr__;
    case 0xe:
      pcVar10 = "dvec";
LAB_00271175:
      join<char_const(&)[5],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar10,(char (*) [5])ts,ts_1_01);
      return __return_storage_ptr__;
    }
LAB_002711aa:
    join<char_const(&)[7],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar10,(char (*) [7])ts,ts_1_01);
    return __return_storage_ptr__;
  case 0xf:
    if ((this->backend).explicit_struct_type == true) {
      ts_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      (*(this->super_Compiler)._vptr_Compiler[6])
                (&local_58,this,(ulong)(type->super_IVariant).self.id);
      join<char_const(&)[8],std::__cxx11::string>
                (__return_storage_ptr__,(spirv_cross *)"struct ",(char (*) [8])&local_58,ts_1_00);
      ::std::__cxx11::string::~string((string *)&local_58);
      return __return_storage_ptr__;
    }
    (*(this->super_Compiler)._vptr_Compiler[6])
              (__return_storage_ptr__,this,(ulong)(type->super_IVariant).self.id,1);
    return __return_storage_ptr__;
  case 0x10:
  case 0x11:
    (*(this->super_Compiler)._vptr_Compiler[0x17])(__return_storage_ptr__,this,type);
    return __return_storage_ptr__;
  case 0x12:
    sVar6 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).comparison_ids._M_h,&id_local);
    pcVar10 = "samplerShadow";
    if (sVar6 == 0) {
      pcVar10 = "sampler";
    }
    break;
  case 0x13:
    pcVar10 = "accelerationStructureNV";
    if (this->ray_tracing_is_khr != false) {
      pcVar10 = "accelerationStructureEXT";
    }
    break;
  case 0x14:
    pcVar10 = "rayQueryEXT";
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar10,(allocator *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	if (type.pointer && type.storage == StorageClassPhysicalStorageBufferEXT && type.basetype != SPIRType::Struct)
	{
		// Need to create a magic type name which compacts the entire type information.
		string name = type_to_glsl(get_pointee_type(type));
		for (size_t i = 0; i < type.array.size(); i++)
		{
			if (type.array_size_literal[i])
				name += join(type.array[i], "_");
			else
				name += join("id", type.array[i], "_");
		}
		name += "Pointer";
		return name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id);

	case SPIRType::Sampler:
		// The depth field is set by calling code based on the variable ID of the sampler, effectively reintroducing
		// this distinction into the type system.
		return comparison_ids.count(id) ? "samplerShadow" : "sampler";

	case SPIRType::AccelerationStructure:
		return ray_tracing_is_khr ? "accelerationStructureEXT" : "accelerationStructureNV";

	case SPIRType::RayQuery:
		return "rayQueryEXT";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.basetype == SPIRType::UInt && is_legacy())
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::SByte:
			return backend.basic_int8_type;
		case SPIRType::UByte:
			return backend.basic_uint8_type;
		case SPIRType::Short:
			return backend.basic_int16_type;
		case SPIRType::UShort:
			return backend.basic_uint16_type;
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			return "float16_t";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			return "int64_t";
		case SPIRType::UInt64:
			return "uint64_t";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bvec", type.vecsize);
		case SPIRType::SByte:
			return join("i8vec", type.vecsize);
		case SPIRType::UByte:
			return join("u8vec", type.vecsize);
		case SPIRType::Short:
			return join("i16vec", type.vecsize);
		case SPIRType::UShort:
			return join("u16vec", type.vecsize);
		case SPIRType::Int:
			return join("ivec", type.vecsize);
		case SPIRType::UInt:
			return join("uvec", type.vecsize);
		case SPIRType::Half:
			return join("f16vec", type.vecsize);
		case SPIRType::Float:
			return join("vec", type.vecsize);
		case SPIRType::Double:
			return join("dvec", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else if (type.vecsize == type.columns) // Simple Matrix builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}